

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall
brown::Tile::print6x8(Tile *this,int ox,int y,uint32_t fcol,uint32_t bcol,char *fmt,...)

{
  long lVar1;
  char cVar2;
  char in_AL;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined1 local_4e8 [48];
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char st [1024];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    arglist[0].reg_save_area = local_4e8;
    arglist[0].overflow_arg_area = &stack0x00000008;
    arglist[0].gp_offset = 0x30;
    arglist[0].fp_offset = 0x30;
    iVar3 = vsnprintf(st,0x3ff,fmt,arglist);
    if (iVar3 != 0) {
      st[0x3ff] = '\0';
    }
    iVar3 = this->p;
    lVar4 = (long)(iVar3 * y) + this->f;
    for (uVar5 = 1; (int)uVar5 < 0x100; uVar5 = uVar5 * 2) {
      if ((uint)y < (uint)this->y) {
        pcVar8 = st;
        iVar3 = ox;
        while( true ) {
          cVar2 = *pcVar8;
          if ((long)cVar2 == 0) break;
          lVar1 = lVar4 + (long)iVar3 * 4;
          uVar9 = -iVar3;
          uVar10 = 0;
          if (iVar3 < 0) {
            uVar10 = (ulong)uVar9;
          }
          iVar6 = this->x - iVar3;
          if (5 < iVar6) {
            iVar6 = 6;
          }
          for (; (long)uVar10 < (long)iVar6; uVar10 = uVar10 + 1) {
            uVar7 = fcol;
            if ((uVar5 & (int)(char)font6x8[(long)cVar2 * 6 + uVar10]) == 0) {
              uVar7 = bcol;
            }
            *(uint32_t *)(lVar1 + uVar10 * 4) = uVar7;
          }
          if (cVar2 == '\t') {
            uVar10 = (ulong)uVar9;
            if ((int)uVar9 < 7) {
              uVar10 = 6;
            }
            iVar6 = this->x - iVar3;
            if (0x11 < iVar6) {
              iVar6 = 0x12;
            }
            for (; (long)uVar10 < (long)iVar6; uVar10 = uVar10 + 1) {
              *(uint32_t *)(lVar1 + uVar10 * 4) = bcol;
            }
            iVar3 = iVar3 + 0xc;
          }
          pcVar8 = pcVar8 + 1;
          iVar3 = iVar3 + 6;
        }
        iVar3 = this->p;
      }
      y = y + 1;
      lVar4 = lVar4 + iVar3;
    }
  }
  return;
}

Assistant:

void Tile::print6x8 (int ox, int y, std::uint32_t fcol, std::uint32_t bcol, const char *fmt, ...)
{
    std::va_list arglist;
    char st[1024], *c, *v;
    int i, j, ie, x;
    std::uint32_t *lp, *lpx;

    if (!fmt) return;
    va_start(arglist,fmt);
    if (vsnprintf((char *)&st,sizeof(st)-1,fmt,arglist)) st[sizeof(st)-1] = 0;
    va_end(arglist);

    lp = (std::uint32_t *)(y*this->p+this->f);
    for(j=1;j<256;y++,lp=(std::uint32_t *)(((intptr_t)lp)+this->p),j+=j)
        if ((unsigned)y < (unsigned)this->y)
            for(c=st,x=ox;*c;c++,x+=6)
            {
                v = ((int)(*c))*6 + ((char *)font6x8); lpx = &lp[x];
                for(i=max(-x,0),ie=min(this->x-x,6);i<ie;i++) { if (v[i]&j) lpx[i] = fcol; else if (bcol >= 0) lpx[i] = bcol; }
                if ((*c) == 9) { if (bcol >= 0) { for(i=max(-x,6),ie=min(this->x-x,18);i<ie;i++) lpx[i] = bcol; } x += 2*6; }
            }
}